

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

asn_enc_rval_t *
INTEGER_encode_der(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                  int tag_mode,ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar1 = *sptr;
  if (pcVar1 != (char *)0x0) {
    for (lVar5 = 0; pcVar2 = pcVar1 + lVar5, pcVar2 < pcVar1 + (long)*(int *)((long)sptr + 8) + -1;
        lVar5 = lVar5 + 1) {
      if (*pcVar2 == -1) {
        if (-1 < pcVar1[lVar5 + 1]) break;
      }
      else if ((*pcVar2 != '\0') || (pcVar1[lVar5 + 1] < '\0')) break;
    }
    if ((int)lVar5 != 0) {
      iVar3 = *(int *)((long)sptr + 8) - (int)lVar5;
      *(int *)((long)sptr + 8) = iVar3;
      pcVar4 = pcVar1 + iVar3;
      for (; pcVar1 < pcVar4; pcVar1 = pcVar1 + 1) {
        *pcVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
    }
  }
  der_encode_primitive(__return_storage_ptr__,td,sptr,tag_mode,tag,cb,app_key);
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_der(asn_TYPE_descriptor_t *td, void *sptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	INTEGER_t *st = (INTEGER_t *)sptr;

	ASN_DEBUG("%s %s as INTEGER (tm=%d)",
		cb?"Encoding":"Estimating", td->name, tag_mode);

	/*
	 * Canonicalize integer in the buffer.
	 * (Remove too long sign extension, remove some first 0x00 bytes)
	 */
	if(st->buf) {
		uint8_t *buf = st->buf;
		uint8_t *end1 = buf + st->size - 1;
		int shift;

		/* Compute the number of superfluous leading bytes */
		for(; buf < end1; buf++) {
			/*
			 * If the contents octets of an integer value encoding
			 * consist of more than one octet, then the bits of the
			 * first octet and bit 8 of the second octet:
			 * a) shall not all be ones; and
			 * b) shall not all be zero.
			 */
			switch(*buf) {
			case 0x00: if((buf[1] & 0x80) == 0)
					continue;
				break;
			case 0xff: if((buf[1] & 0x80))
					continue;
				break;
			}
			break;
		}

		/* Remove leading superfluous bytes from the integer */
		shift = buf - st->buf;
		if(shift) {
			uint8_t *nb = st->buf;
			uint8_t *end;

			st->size -= shift;	/* New size, minus bad bytes */
			end = nb + st->size;

			for(; nb < end; nb++, buf++)
				*nb = *buf;
		}

	} /* if(1) */

	return der_encode_primitive(td, sptr, tag_mode, tag, cb, app_key);
}